

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Native_File_Chooser_FLTK.cxx
# Opt level: O0

void __thiscall Fl_FLTK_File_Chooser::Fl_FLTK_File_Chooser(Fl_FLTK_File_Chooser *this,int val)

{
  Fl_File_Chooser *this_00;
  int val_local;
  Fl_FLTK_File_Chooser *this_local;
  
  this->_vptr_Fl_FLTK_File_Chooser = (_func_int **)&PTR__Fl_FLTK_File_Chooser_002ecd98;
  this->_btype = 0;
  this->_options = 0;
  this->_filter = (char *)0x0;
  this->_filtvalue = 0;
  this->_parsedfilt = (char *)0x0;
  this->_preset_file = (char *)0x0;
  this->_prevvalue = (char *)0x0;
  this->_directory = (char *)0x0;
  this->_errmsg = (char *)0x0;
  this->_file_chooser = (Fl_File_Chooser *)0x0;
  if (-1 < val) {
    this_00 = (Fl_File_Chooser *)operator_new(0x18b0);
    Fl_File_Chooser::Fl_File_Chooser(this_00,(char *)0x0,(char *)0x0,0,(char *)0x0);
    this->_file_chooser = this_00;
    (*this->_vptr_Fl_FLTK_File_Chooser[2])(this,(ulong)(uint)val);
  }
  this->_nfilters = 0;
  return;
}

Assistant:

Fl_FLTK_File_Chooser::Fl_FLTK_File_Chooser(int val) {
  _btype       = 0;
  _options     = 0;
  _filter      = NULL;
  _filtvalue   = 0;
  _parsedfilt  = NULL;
  _preset_file = NULL;
  _prevvalue   = NULL;
  _directory   = NULL;
  _errmsg      = NULL;
  _file_chooser= NULL;
  if (val >= 0) {
    _file_chooser = new Fl_File_Chooser(NULL, NULL, 0, NULL);
    type(val);			// do this after _file_chooser created
    }
  _nfilters    = 0;
}